

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O2

result * baryonyx::itm::select_float
                   (result *__return_storage_ptr__,context *ctx,problem *pb,bool is_optimization)

{
  bool bVar1;
  floating_point_type fVar2;
  objective_function_type oVar3;
  pointer poVar4;
  pointer poVar5;
  undefined7 in_register_00000009;
  
  fVar2 = (ctx->parameters).float_type;
  oVar3 = pb->type;
  poVar4 = (pb->objective).qelements.
           super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar5 = (pb->objective).qelements.
           super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar1 = (ctx->parameters).debug;
  if (fVar2 == double_type) {
    if (oVar3 == maximize) {
      if (poVar4 == poVar5) {
        if (bVar1 == false) {
          if (is_optimization) {
            optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>
                      (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                       (problem *)CONCAT71(in_register_00000009,is_optimization));
          }
          else {
            solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>
                      (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                       (problem *)CONCAT71(in_register_00000009,is_optimization));
          }
        }
        else if (is_optimization) {
          optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>
                    (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                     (problem *)CONCAT71(in_register_00000009,is_optimization));
        }
        else {
          solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>
                    (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                     (problem *)CONCAT71(in_register_00000009,is_optimization));
        }
      }
      else if (bVar1 == false) {
        if (is_optimization) {
          optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>
                    (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                     (problem *)CONCAT71(in_register_00000009,is_optimization));
        }
        else {
          solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>
                    (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                     (problem *)CONCAT71(in_register_00000009,is_optimization));
        }
      }
      else if (is_optimization) {
        optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
      else {
        solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
    }
    else if (poVar4 == poVar5) {
      if (bVar1 == false) {
        if (is_optimization) {
          optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>
                    (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                     (problem *)CONCAT71(in_register_00000009,is_optimization));
        }
        else {
          solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>
                    (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                     (problem *)CONCAT71(in_register_00000009,is_optimization));
        }
      }
      else if (is_optimization) {
        optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
      else {
        solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
    }
    else if (bVar1 == false) {
      if (is_optimization) {
        optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
      else {
        solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
    }
    else if (is_optimization) {
      optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
                (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                 (problem *)CONCAT71(in_register_00000009,is_optimization));
    }
    else {
      solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
                (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                 (problem *)CONCAT71(in_register_00000009,is_optimization));
    }
  }
  else if (fVar2 == float_type) {
    if (oVar3 == maximize) {
      if (poVar4 == poVar5) {
        if (bVar1 == false) {
          if (is_optimization) {
            optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>
                      (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                       (problem *)CONCAT71(in_register_00000009,is_optimization));
          }
          else {
            solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>
                      (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                       (problem *)CONCAT71(in_register_00000009,is_optimization));
          }
        }
        else if (is_optimization) {
          optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>
                    (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                     (problem *)CONCAT71(in_register_00000009,is_optimization));
        }
        else {
          solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>>
                    (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                     (problem *)CONCAT71(in_register_00000009,is_optimization));
        }
      }
      else if (bVar1 == false) {
        if (is_optimization) {
          optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
                    (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                     (problem *)CONCAT71(in_register_00000009,is_optimization));
        }
        else {
          solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
                    (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                     (problem *)CONCAT71(in_register_00000009,is_optimization));
        }
      }
      else if (is_optimization) {
        optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
      else {
        solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
    }
    else if (poVar4 == poVar5) {
      if (bVar1 == false) {
        if (is_optimization) {
          optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
                    (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                     (problem *)CONCAT71(in_register_00000009,is_optimization));
        }
        else {
          solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
                    (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                     (problem *)CONCAT71(in_register_00000009,is_optimization));
        }
      }
      else if (is_optimization) {
        optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
      else {
        solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
    }
    else if (bVar1 == false) {
      if (is_optimization) {
        optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
      else {
        solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
    }
    else if (is_optimization) {
      optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>
                (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                 (problem *)CONCAT71(in_register_00000009,is_optimization));
    }
    else {
      solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>
                (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                 (problem *)CONCAT71(in_register_00000009,is_optimization));
    }
  }
  else if (oVar3 == maximize) {
    if (poVar4 == poVar5) {
      if (bVar1 == false) {
        if (is_optimization) {
          optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
                    (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                     (problem *)CONCAT71(in_register_00000009,is_optimization));
        }
        else {
          solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
                    (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                     (problem *)CONCAT71(in_register_00000009,is_optimization));
        }
      }
      else if (is_optimization) {
        optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
      else {
        solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
    }
    else if (bVar1 == false) {
      if (is_optimization) {
        optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
      else {
        solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
    }
    else if (is_optimization) {
      optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
                (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                 (problem *)CONCAT71(in_register_00000009,is_optimization));
    }
    else {
      solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
                (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                 (problem *)CONCAT71(in_register_00000009,is_optimization));
    }
  }
  else if (poVar4 == poVar5) {
    if (bVar1 == false) {
      if (is_optimization) {
        optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
      else {
        solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>
                  (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                   (problem *)CONCAT71(in_register_00000009,is_optimization));
      }
    }
    else if (is_optimization) {
      optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>
                (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                 (problem *)CONCAT71(in_register_00000009,is_optimization));
    }
    else {
      solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>
                (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                 (problem *)CONCAT71(in_register_00000009,is_optimization));
    }
  }
  else if (bVar1 == false) {
    if (is_optimization) {
      optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
                (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                 (problem *)CONCAT71(in_register_00000009,is_optimization));
    }
    else {
      solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
                (__return_storage_ptr__,(itm *)ctx,(context *)pb,
                 (problem *)CONCAT71(in_register_00000009,is_optimization));
    }
  }
  else if (is_optimization) {
    optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
              (__return_storage_ptr__,(itm *)ctx,(context *)pb,
               (problem *)CONCAT71(in_register_00000009,is_optimization));
  }
  else {
    solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
              (__return_storage_ptr__,(itm *)ctx,(context *)pb,
               (problem *)CONCAT71(in_register_00000009,is_optimization));
  }
  return __return_storage_ptr__;
}

Assistant:

static result
select_float(const context& ctx, const problem& pb, bool is_optimization)
{
    const auto f = static_cast<int>(ctx.parameters.float_type);

    if (f == 0)
        return select_mode<float_sel<0>>(ctx, pb, is_optimization);
    else if (f == 1)
        return select_mode<float_sel<1>>(ctx, pb, is_optimization);
    else
        return select_mode<float_sel<2>>(ctx, pb, is_optimization);
}